

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadVerilog.c
# Opt level: O2

Abc_Ntk_t * Io_ReadVerilog(char *pFileName,int fCheck)

{
  int iVar1;
  Abc_Des_t *p;
  Abc_Ntk_t *pNtk;
  void *pvVar2;
  char *pcVar3;
  
  pNtk = (Abc_Ntk_t *)0x0;
  p = Ver_ParseFile(pFileName,(Abc_Des_t *)0x0,fCheck,1);
  if (p != (Abc_Des_t *)0x0) {
    iVar1 = Abc_DesFindTopLevelModels(p);
    pNtk = (Abc_Ntk_t *)Vec_PtrEntry(p->vTops,0);
    if (1 < iVar1) {
      printf("Warning: The design has %d root-level modules: ",(ulong)(uint)p->vTops->nSize);
      for (iVar1 = 0; iVar1 < p->vTops->nSize; iVar1 = iVar1 + 1) {
        pvVar2 = Vec_PtrEntry(p->vTops,iVar1);
        printf(" %s",*(undefined8 *)((long)pvVar2 + 8));
      }
      putchar(10);
      printf("The first one (%s) will be used.\n",pNtk->pName);
    }
    pNtk->pDesign = p;
    p->pManFunc = (void *)0x0;
    iVar1 = p->vModules->nSize;
    if (iVar1 < 1) {
      __assert_fail("Vec_PtrSize(pDesign->vModules) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadVerilog.c"
                    ,0x4c,"Abc_Ntk_t *Io_ReadVerilog(char *, int)");
    }
    if (iVar1 == 1) {
      Abc_DesFree(p,pNtk);
      pNtk->pDesign = (Abc_Des_t *)0x0;
      pcVar3 = Extra_UtilStrsav(pFileName);
      pNtk->pSpec = pcVar3;
    }
    else {
      Abc_NtkIsAcyclicHierarchy(pNtk);
    }
  }
  return pNtk;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

//extern Abc_Des_t * Ver_ParseFile( char * pFileName, Abc_Des_t * pGateLib, int fCheck, int fUseMemMan );

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Reads hierarchical design from the Verilog file.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Ntk_t * Io_ReadVerilog( char * pFileName, int fCheck )
{
    Abc_Ntk_t * pNtk, * pTemp;
    Abc_Des_t * pDesign;
    int i, RetValue;

    // parse the verilog file
    pDesign = Ver_ParseFile( pFileName, NULL, fCheck, 1 );
    if ( pDesign == NULL )
        return NULL;

    // detect top-level model
    RetValue = Abc_DesFindTopLevelModels( pDesign );
    pNtk = (Abc_Ntk_t *)Vec_PtrEntry( pDesign->vTops, 0 );
    if ( RetValue > 1 )
    {
        printf( "Warning: The design has %d root-level modules: ", Vec_PtrSize(pDesign->vTops) );
        Vec_PtrForEachEntry( Abc_Ntk_t *, pDesign->vTops, pTemp, i )
            printf( " %s", Abc_NtkName(pTemp) );
        printf( "\n" );
        printf( "The first one (%s) will be used.\n", pNtk->pName );
    }

    // extract the master network
    pNtk->pDesign = pDesign;
    pDesign->pManFunc = NULL;

    // verify the design for cyclic dependence
    assert( Vec_PtrSize(pDesign->vModules) > 0 );
    if ( Vec_PtrSize(pDesign->vModules) == 1 )
    {
//        printf( "Warning: The design is not hierarchical.\n" );
        Abc_DesFree( pDesign, pNtk );
        pNtk->pDesign = NULL;
        pNtk->pSpec = Extra_UtilStrsav( pFileName );
    }
    else
    {
        // check that there is no cyclic dependency
        Abc_NtkIsAcyclicHierarchy( pNtk );
    }

//Io_WriteVerilog( pNtk, "_temp.v" );
//    Abc_NtkPrintBoxInfo( pNtk );
    return pNtk;
}